

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention_x86.cpp
# Opt level: O1

int __thiscall
ncnn::MultiHeadAttention_x86::forward
          (MultiHeadAttention_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *_opt)

{
  undefined8 *puVar1;
  int iVar2;
  int *piVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  size_t sVar6;
  long *plVar7;
  int iVar8;
  int iVar9;
  void *pvVar10;
  undefined4 uVar11;
  long *plVar12;
  undefined4 uVar13;
  ulong uVar14;
  int iVar15;
  int _w;
  int iVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  pointer pMVar20;
  void *pvVar21;
  int iVar22;
  pointer pMVar23;
  ulong uVar24;
  Allocator *pAVar25;
  void *pvVar26;
  long lVar27;
  bool bVar28;
  Option opt1;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qk_bottom_blobs;
  Option opt;
  vector<int,_std::allocator<int>_> retqkvs;
  vector<int,_std::allocator<int>_> retqks;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qkv_bottom_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qk_top_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qkv_top_blobs;
  value_type local_388;
  long local_340;
  long local_338;
  long local_330;
  Mat local_328;
  long local_2d8;
  Allocator *local_2d0;
  pointer local_2c8;
  MultiHeadAttention_x86 *local_2c0;
  Mat local_2b8;
  Mat local_268;
  Mat local_218;
  void *local_1c8;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  undefined4 local_1b8;
  undefined4 uStack_1b4;
  undefined4 local_1b0;
  long *local_1a8;
  undefined4 uStack_1a0;
  int iStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 local_190;
  undefined8 local_188;
  void *local_178;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 local_168;
  undefined4 uStack_164;
  undefined4 local_160;
  long *local_158;
  undefined4 uStack_150;
  int iStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined4 local_140;
  undefined8 local_138;
  Option local_128;
  vector<int,_std::allocator<int>_> local_e8;
  vector<int,_std::allocator<int>_> local_c8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_a8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_a0;
  Option local_88;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_48;
  
  pMVar23 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  lVar18 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pMVar23;
  pMVar20 = pMVar23;
  if (lVar18 != 0x48) {
    lVar19 = 0;
    if ((this->super_MultiHeadAttention).attn_mask == 0) {
      lVar19 = 0x48;
    }
    if (lVar18 != 0x90) {
      lVar19 = 0x48;
    }
    pMVar20 = (pointer)((long)&pMVar23->data + lVar19);
  }
  local_2c8 = pMVar23;
  if ((lVar18 != 0x48) &&
     (iVar16 = (this->super_MultiHeadAttention).attn_mask, iVar16 == 0 || lVar18 != 0x90)) {
    local_2c8 = pMVar20;
    if (iVar16 == 0) {
      local_2c8 = pMVar23 + 2;
    }
    if (lVar18 != 0xd8) {
      local_2c8 = pMVar23 + 2;
    }
    if (lVar18 == 0x90) {
      local_2c8 = pMVar20;
    }
  }
  if ((this->super_MultiHeadAttention).attn_mask == 0) {
    local_218.cstep = 0;
    local_218.data = (void *)0x0;
    local_218.refcount._0_4_ = 0;
    local_218.refcount._4_4_ = 0;
    local_218.elemsize._0_4_ = 0;
    local_218.elemsize._4_4_ = 0;
    local_218.elempack = 0;
    local_218.allocator = (Allocator *)0x0;
    local_218.dims = 0;
    local_218.w = 0;
    local_218.h = 0;
    local_218.d = 0;
    local_218.c = 0;
  }
  else {
    local_218.data = *(void **)((long)pMVar23 + lVar18 + -0x48);
    piVar3 = *(int **)((long)pMVar23 + lVar18 + -0x40);
    local_218.refcount._0_4_ = SUB84(piVar3,0);
    local_218.refcount._4_4_ = (undefined4)((ulong)piVar3 >> 0x20);
    uVar4 = *(undefined8 *)((long)pMVar23 + lVar18 + -0x38);
    local_218.elemsize._0_4_ = (undefined4)uVar4;
    local_218.elemsize._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
    local_218.elempack = *(int *)((long)pMVar23 + lVar18 + -0x30);
    local_218.allocator = *(Allocator **)((long)pMVar23 + lVar18 + -0x28);
    puVar1 = (undefined8 *)((long)pMVar23 + lVar18 + -0x20);
    uVar4 = *puVar1;
    uVar5 = puVar1[1];
    local_218.dims = (int)uVar4;
    local_218.w = (int)((ulong)uVar4 >> 0x20);
    local_218.h = (int)uVar5;
    local_218.d = (int)((ulong)uVar5 >> 0x20);
    local_218.c = *(int *)((long)pMVar23 + lVar18 + -0x10);
    local_218.cstep = *(ulong *)((long)pMVar23 + lVar18 + -8);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
  }
  local_128.lightmode = _opt->lightmode;
  local_128.use_shader_pack8 = _opt->use_shader_pack8;
  local_128.use_subgroup_ops = _opt->use_subgroup_ops;
  local_128.use_reserved_0 = _opt->use_reserved_0;
  local_128.num_threads = _opt->num_threads;
  local_128.blob_allocator = _opt->blob_allocator;
  local_128.workspace_allocator._0_4_ = *(undefined4 *)&_opt->workspace_allocator;
  local_128.workspace_allocator._4_4_ = *(undefined4 *)((long)&_opt->workspace_allocator + 4);
  local_128.openmp_blocktime = _opt->openmp_blocktime;
  local_128.use_winograd_convolution = _opt->use_winograd_convolution;
  local_128.use_sgemm_convolution = _opt->use_sgemm_convolution;
  local_128.use_int8_inference = _opt->use_int8_inference;
  local_128.use_vulkan_compute = _opt->use_vulkan_compute;
  local_128.use_bf16_storage = _opt->use_bf16_storage;
  local_128.use_fp16_packed = _opt->use_fp16_packed;
  local_128.use_fp16_storage = _opt->use_fp16_storage;
  local_128.use_fp16_arithmetic = _opt->use_fp16_arithmetic;
  local_128.use_int8_packed = _opt->use_int8_packed;
  local_128.use_int8_storage = _opt->use_int8_storage;
  local_128.use_int8_arithmetic = _opt->use_int8_arithmetic;
  local_128.use_packing_layout = _opt->use_packing_layout;
  local_128.vulkan_device_index = _opt->vulkan_device_index;
  local_128.use_reserved_1 = _opt->use_reserved_1;
  local_128.use_image_storage = _opt->use_image_storage;
  local_128.use_tensor_storage = _opt->use_tensor_storage;
  local_128.use_reserved_2 = _opt->use_reserved_2;
  local_128.flush_denormals = _opt->flush_denormals;
  local_128.use_local_pool_allocator = _opt->use_local_pool_allocator;
  local_128.use_shader_local_memory = _opt->use_shader_local_memory;
  local_128.use_cooperative_matrix = _opt->use_cooperative_matrix;
  local_128.use_winograd23_convolution = _opt->use_winograd23_convolution;
  local_128.use_winograd43_convolution = _opt->use_winograd43_convolution;
  local_128.use_winograd63_convolution = _opt->use_winograd63_convolution;
  local_128.use_a53_a55_optimized_kernel = _opt->use_a53_a55_optimized_kernel;
  local_128.use_fp16_uniform = _opt->use_fp16_uniform;
  local_128.use_int8_uniform = _opt->use_int8_uniform;
  local_128.use_reserved_9 = _opt->use_reserved_9;
  local_128.use_reserved_10 = _opt->use_reserved_10;
  local_128.use_reserved_11 = _opt->use_reserved_11;
  if ((this->super_MultiHeadAttention).int8_scale_term != 0) {
    local_128._36_4_ = local_128._36_4_ & 0xffffff;
  }
  local_328.cstep = 0;
  local_328.data = (void *)0x0;
  local_328.refcount._0_4_ = 0;
  local_328.refcount._4_4_ = 0;
  local_328.elemsize._0_4_ = 0;
  local_328.elemsize._4_4_ = 0;
  local_328.elempack = 0;
  local_328.allocator = (Allocator *)0x0;
  local_328.dims = 0;
  local_328.w = 0;
  local_328.h = 0;
  local_328.d = 0;
  local_328.c = 0;
  local_a8 = top_blobs;
  if (((this->super_MultiHeadAttention).attn_mask == 0) || (local_218.elempack == 1)) {
    piVar3 = (int *)CONCAT44(local_218.refcount._4_4_,local_218.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    local_328.data = local_218.data;
    local_328.refcount._0_4_ = local_218.refcount._0_4_;
    local_328.refcount._4_4_ = local_218.refcount._4_4_;
    local_328.elemsize._0_4_ = (undefined4)local_218.elemsize;
    local_328.elemsize._4_4_ = local_218.elemsize._4_4_;
    local_328.elempack = local_218.elempack;
    local_328.allocator = local_218.allocator;
    local_328.dims = local_218.dims;
    local_328.w = local_218.w;
    local_328.h = local_218.h;
    local_328.d = local_218.d;
    local_328.c = local_218.c;
    local_328.cstep = local_218.cstep;
  }
  else {
    convert_packing(&local_218,&local_328,1,&local_128);
    iVar16 = -100;
    if ((local_328.data == (void *)0x0) || ((long)local_328.c * local_328.cstep == 0))
    goto LAB_00562dac;
  }
  iVar15 = (this->super_MultiHeadAttention).embed_dim / (this->super_MultiHeadAttention).num_heads;
  _w = pMVar23->elempack * pMVar23->h;
  iVar22 = pMVar20->elempack;
  iVar2 = pMVar20->h;
  local_138 = 0;
  local_178 = (void *)0x0;
  uStack_170 = 0;
  uStack_16c = 0;
  local_168 = 0;
  uStack_164 = 0;
  local_160 = 0;
  local_158 = (long *)0x0;
  uStack_150 = 0;
  iStack_14c = 0;
  uStack_148 = 0;
  uStack_144 = 0;
  local_140 = 0;
  iVar16 = (*this->q_gemm->_vptr_Layer[7])(this->q_gemm,pMVar23,&local_178,&local_128);
  if (iVar16 == 0) {
    local_188 = 0;
    local_1c8 = (void *)0x0;
    uStack_1c0 = 0;
    uStack_1bc = 0;
    local_1b8 = 0;
    uStack_1b4 = 0;
    local_1b0 = 0;
    local_1a8 = (long *)0x0;
    uStack_1a0 = 0;
    iStack_19c = 0;
    uStack_198 = 0;
    uStack_194 = 0;
    local_190 = 0;
    iVar16 = (*this->k_gemm->_vptr_Layer[7])(this->k_gemm,pMVar20,&local_1c8,&local_128);
    if (iVar16 == 0) {
      local_268.cstep = 0;
      local_268.data = (void *)0x0;
      local_268.refcount._0_4_ = 0;
      local_268.refcount._4_4_ = 0;
      local_268.elemsize._0_4_ = 0;
      local_268.elemsize._4_4_ = 0;
      local_268.elempack = 0;
      local_268.allocator = (Allocator *)0x0;
      local_268.dims = 0;
      local_268.w = 0;
      local_268.h = 0;
      local_268.d = 0;
      local_268.c = 0;
      Mat::create(&local_268,iVar22 * iVar2,(this->super_MultiHeadAttention).num_heads * _w,4,
                  local_128.blob_allocator);
      iVar16 = -100;
      if ((local_268.data != (void *)0x0) && ((long)local_268.c * local_268.cstep != 0)) {
        local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (int *)0x0;
        local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::vector<int,_std::allocator<int>_>::resize
                  (&local_c8,(long)(this->super_MultiHeadAttention).num_heads);
        uVar17 = (this->super_MultiHeadAttention).num_heads;
        local_2c0 = this;
        if (0 < (int)uVar17) {
          local_338 = (long)iVar15;
          lVar18 = 0;
          local_2d8 = 0;
          local_340 = 0;
          do {
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                      ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_2b8,2,
                       (allocator_type *)&local_388);
            iVar16 = iStack_14c;
            plVar7 = local_158;
            uVar13 = local_160;
            pvVar21 = local_2b8.data;
            lVar27 = (long)iStack_14c;
            lVar19 = CONCAT44(uStack_164,local_168);
            pvVar26 = (void *)(lVar18 * lVar27 * lVar19 + (long)local_178);
            piVar3 = *(int **)((long)local_2b8.data + 8);
            local_330 = lVar18;
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (*(long **)((long)local_2b8.data + 0x20) == (long *)0x0) {
                  if (*local_2b8.data != (void *)0x0) {
                    free(*local_2b8.data);
                  }
                }
                else {
                  (**(code **)(**(long **)((long)local_2b8.data + 0x20) + 0x18))();
                }
              }
            }
            iVar22 = iStack_19c;
            plVar12 = local_1a8;
            uVar11 = local_1b0;
            pvVar10 = local_2b8.data;
            *(long *)pvVar21 = 0;
            *(long *)((long)pvVar21 + 8) = 0;
            *(undefined8 *)((long)pvVar21 + 0xc) = 0;
            *(undefined8 *)((long)pvVar21 + 0x14) = 0;
            *(long *)((long)pvVar21 + 0x28) = 0;
            *(long *)((long)pvVar21 + 0x30) = 0;
            *(void **)pvVar21 = pvVar26;
            *(long *)((long)pvVar21 + 8) = 0;
            *(long *)((long)pvVar21 + 0x10) = lVar19;
            *(undefined4 *)((long)pvVar21 + 0x18) = uVar13;
            *(long **)((long)pvVar21 + 0x20) = plVar7;
            *(undefined4 *)((long)pvVar21 + 0x28) = 2;
            *(int *)((long)pvVar21 + 0x2c) = iVar16;
            *(int *)((long)pvVar21 + 0x30) = iVar15;
            *(undefined4 *)((long)pvVar21 + 0x34) = 1;
            *(undefined4 *)((long)pvVar21 + 0x38) = 1;
            *(long *)((long)pvVar21 + 0x40) = lVar27 * local_338;
            lVar19 = (long)iStack_19c;
            lVar18 = CONCAT44(uStack_1b4,local_1b8);
            pvVar21 = (void *)(local_330 * lVar19 * lVar18 + (long)local_1c8);
            piVar3 = *(int **)((long)local_2b8.data + 0x50);
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (*(long **)((long)local_2b8.data + 0x68) == (long *)0x0) {
                  if (*(void **)((long)local_2b8.data + 0x48) != (void *)0x0) {
                    free(*(void **)((long)local_2b8.data + 0x48));
                  }
                }
                else {
                  (**(code **)(**(long **)((long)local_2b8.data + 0x68) + 0x18))();
                }
              }
            }
            *(long *)((long)pvVar10 + 0x88) = 0;
            *(undefined8 *)((long)pvVar10 + 0x54) = 0;
            *(undefined8 *)((long)pvVar10 + 0x5c) = 0;
            *(long *)((long)pvVar10 + 0x48) = 0;
            *(long *)((long)pvVar10 + 0x50) = 0;
            *(long *)((long)pvVar10 + 0x70) = 0;
            *(long *)((long)pvVar10 + 0x78) = 0;
            *(void **)((long)pvVar10 + 0x48) = pvVar21;
            *(long *)((long)pvVar10 + 0x50) = 0;
            *(long *)((long)pvVar10 + 0x58) = lVar18;
            *(undefined4 *)((long)pvVar10 + 0x60) = uVar11;
            *(long **)((long)pvVar10 + 0x68) = plVar12;
            *(undefined4 *)((long)pvVar10 + 0x70) = 2;
            *(int *)((long)pvVar10 + 0x74) = iVar22;
            *(int *)((long)pvVar10 + 0x78) = iVar15;
            *(undefined4 *)((long)pvVar10 + 0x7c) = 1;
            *(undefined4 *)((long)pvVar10 + 0x80) = 1;
            *(long *)((long)pvVar10 + 0x88) = lVar19 * local_338;
            if ((local_2c0->super_MultiHeadAttention).attn_mask != 0) {
              if (local_328.dims == 3) {
                local_388.cstep = CONCAT44(local_328.elemsize._4_4_,(undefined4)local_328.elemsize);
                local_388.data =
                     (void *)(local_328.cstep * local_340 * local_388.cstep + (long)local_328.data);
                local_388.refcount._0_4_ = 0;
                local_388.refcount._4_4_ = 0;
                local_388.d = 1;
                local_388.c = local_328.d;
                local_388.cstep =
                     ((long)local_328.h * (long)local_328.w * local_388.cstep + 0xf &
                     0xfffffffffffffff0) / local_388.cstep;
                local_388.dims = 2;
              }
              else {
                piVar3 = (int *)CONCAT44(local_328.refcount._4_4_,local_328.refcount._0_4_);
                local_388.data = local_328.data;
                local_388.refcount._0_4_ = local_328.refcount._0_4_;
                local_388.refcount._4_4_ = local_328.refcount._4_4_;
                local_388.dims = local_328.dims;
                local_388.d = local_328.d;
                local_388.c = local_328.c;
                local_388.cstep = local_328.cstep;
                if (piVar3 != (int *)0x0) {
                  LOCK();
                  *piVar3 = *piVar3 + 1;
                  UNLOCK();
                }
              }
              local_388.h = local_328.h;
              local_388.w = local_328.w;
              local_388.allocator = local_328.allocator;
              local_388.elempack = local_328.elempack;
              local_388.elemsize._4_4_ = local_328.elemsize._4_4_;
              local_388.elemsize._0_4_ = (undefined4)local_328.elemsize;
              std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::push_back
                        ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_2b8,&local_388);
              piVar3 = (int *)CONCAT44(local_388.refcount._4_4_,local_388.refcount._0_4_);
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + -1;
                UNLOCK();
                if (*piVar3 == 0) {
                  if (local_388.allocator == (Allocator *)0x0) {
                    if (local_388.data != (void *)0x0) {
                      free(local_388.data);
                    }
                  }
                  else {
                    (*(local_388.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_388.cstep = 0;
              local_388.data = (void *)0x0;
              local_388.refcount._0_4_ = 0;
              local_388.refcount._4_4_ = 0;
              local_388.elemsize._0_4_ = 0;
              local_388.elemsize._4_4_ = 0;
              local_388.elempack = 0;
              local_388.dims = 0;
              local_388.w = 0;
              local_388.h = 0;
              local_388.d = 0;
              local_388.c = 0;
            }
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                      ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_88,1,
                       (allocator_type *)&local_388);
            iVar22 = local_268.w;
            pAVar25 = local_268.allocator;
            iVar16 = local_268.elempack;
            lVar19 = (long)local_268.w;
            lVar18 = CONCAT44(local_268.elemsize._4_4_,(undefined4)local_268.elemsize);
            pvVar21 = (void *)(local_2d8 * lVar19 * lVar18 + (long)local_268.data);
            pMVar23 = (pointer)(ulong)(uint)local_268.elempack;
            plVar7 = (long *)CONCAT44(local_88.num_threads,local_88._0_4_);
            piVar3 = (int *)plVar7[1];
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if ((long *)plVar7[4] == (long *)0x0) {
                  if ((void *)*plVar7 != (void *)0x0) {
                    free((void *)*plVar7);
                  }
                }
                else {
                  (**(code **)(*(long *)plVar7[4] + 0x18))();
                }
              }
            }
            this = local_2c0;
            *plVar7 = 0;
            plVar7[1] = 0;
            *(undefined8 *)((long)plVar7 + 0xc) = 0;
            *(undefined8 *)((long)plVar7 + 0x14) = 0;
            plVar7[5] = 0;
            plVar7[6] = 0;
            *plVar7 = (long)pvVar21;
            plVar7[1] = 0;
            plVar7[2] = lVar18;
            *(int *)(plVar7 + 3) = iVar16;
            plVar7[4] = (long)pAVar25;
            *(undefined4 *)(plVar7 + 5) = 2;
            *(int *)((long)plVar7 + 0x2c) = iVar22;
            *(int *)(plVar7 + 6) = _w;
            *(undefined4 *)((long)plVar7 + 0x34) = 1;
            *(undefined4 *)(plVar7 + 7) = 1;
            plVar7[8] = lVar19 * _w;
            local_388.refcount._0_4_ = local_128.blob_allocator._0_4_;
            local_388.refcount._4_4_ = local_128.blob_allocator._4_4_;
            local_388.h = local_128.flush_denormals;
            local_388.d._0_1_ = local_128.use_local_pool_allocator;
            local_388.d._1_1_ = local_128.use_shader_local_memory;
            local_388.d._2_1_ = local_128.use_cooperative_matrix;
            local_388.d._3_1_ = local_128.use_winograd23_convolution;
            local_388.c._0_1_ = local_128.use_winograd43_convolution;
            local_388.c._1_1_ = local_128.use_winograd63_convolution;
            local_388.c._2_1_ = local_128.use_a53_a55_optimized_kernel;
            local_388.c._3_1_ = local_128.use_fp16_uniform;
            local_388._60_1_ = local_128.use_int8_uniform;
            local_388._61_1_ = local_128.use_reserved_9;
            local_388._62_1_ = local_128.use_reserved_10;
            local_388._63_1_ = local_128.use_reserved_11;
            local_388.allocator = (Allocator *)CONCAT44(local_128._36_4_,local_128._32_4_);
            local_388.dims = local_128.vulkan_device_index;
            local_388.w._0_1_ = local_128.use_reserved_1;
            local_388.w._1_1_ = local_128.use_image_storage;
            local_388.w._2_1_ = local_128.use_tensor_storage;
            local_388.w._3_1_ = local_128.use_reserved_2;
            local_388.elemsize._0_4_ = local_128.workspace_allocator._0_4_;
            local_388.elemsize._4_4_ = local_128.workspace_allocator._4_4_;
            local_388.elempack = local_128.openmp_blocktime;
            local_388._28_1_ = local_128.use_winograd_convolution;
            local_388._29_1_ = local_128.use_sgemm_convolution;
            local_388._30_1_ = local_128.use_int8_inference;
            local_388._31_1_ = local_128.use_vulkan_compute;
            local_388.data = (void *)CONCAT44(1,local_128._0_4_);
            iVar16 = (*local_2c0->qk_gemm->_vptr_Layer[6])
                               (local_2c0->qk_gemm,&local_2b8,&local_88,&local_388);
            lVar18 = local_340;
            local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[local_340] = iVar16;
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                      ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_88);
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                      ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_2b8);
            local_340 = lVar18 + 1;
            uVar17 = (this->super_MultiHeadAttention).num_heads;
            local_2d8 = local_2d8 + _w;
            lVar18 = local_330 + local_338;
          } while (local_340 < (int)uVar17);
        }
        iVar22 = (int)pMVar23;
        bVar28 = 0 < (int)uVar17;
        if ((0 < (int)uVar17) &&
           (iVar22 = *local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start, iVar22 == 0)) {
          uVar14 = 1;
          do {
            uVar24 = uVar14;
            if (uVar17 == uVar24) break;
            iVar22 = local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar24];
            uVar14 = uVar24 + 1;
          } while (iVar22 == 0);
          bVar28 = uVar24 < uVar17;
        }
        iVar16 = iVar22;
        if (!bVar28) {
          piVar3 = (int *)CONCAT44(uStack_16c,uStack_170);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (local_158 == (long *)0x0) {
                if (local_178 != (void *)0x0) {
                  free(local_178);
                }
              }
              else {
                (**(code **)(*local_158 + 0x18))();
              }
            }
          }
          local_138 = 0;
          local_178 = (void *)0x0;
          uStack_170 = 0;
          uStack_16c = 0;
          local_168 = 0;
          uStack_164 = 0;
          local_160 = 0;
          uStack_150 = 0;
          iStack_14c = 0;
          uStack_148 = 0;
          uStack_144 = 0;
          local_140 = 0;
          piVar3 = (int *)CONCAT44(uStack_1bc,uStack_1c0);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (local_1a8 == (long *)0x0) {
                if (local_1c8 != (void *)0x0) {
                  free(local_1c8);
                }
              }
              else {
                (**(code **)(*local_1a8 + 0x18))();
              }
            }
          }
          local_188 = 0;
          local_1c8 = (void *)0x0;
          uStack_1c0 = 0;
          uStack_1bc = 0;
          local_1b8 = 0;
          uStack_1b4 = 0;
          local_1b0 = 0;
          uStack_1a0 = 0;
          iStack_19c = 0;
          uStack_198 = 0;
          uStack_194 = 0;
          local_190 = 0;
          iVar16 = (*this->qk_softmax->_vptr_Layer[9])(this->qk_softmax,&local_268,&local_128);
          if (iVar16 == 0) {
            local_388.cstep = 0;
            local_388.data = (void *)0x0;
            local_388.refcount._0_4_ = 0;
            local_388.refcount._4_4_ = 0;
            local_388.elemsize._0_4_ = 0;
            local_388.elemsize._4_4_ = 0;
            local_388.elempack = 0;
            local_388.allocator = (Allocator *)0x0;
            local_388.dims = 0;
            local_388.w = 0;
            local_388.h = 0;
            local_388.d = 0;
            local_388.c = 0;
            iVar16 = (*this->v_gemm->_vptr_Layer[7])(this->v_gemm,local_2c8,&local_388,&local_128);
            if (iVar16 == 0) {
              local_2b8.cstep = 0;
              local_2b8.data = (void *)0x0;
              local_2b8.refcount._0_4_ = 0;
              local_2b8.refcount._4_4_ = 0;
              local_2b8.elemsize._0_4_ = 0;
              local_2b8.elemsize._4_4_ = 0;
              local_2b8.elempack = 0;
              local_2b8.allocator = (Allocator *)0x0;
              local_2b8.dims = 0;
              local_2b8.w = 0;
              local_2b8.h = 0;
              local_2b8.d = 0;
              local_2b8.c = 0;
              Mat::create(&local_2b8,_w,(this->super_MultiHeadAttention).num_heads * iVar15,4,
                          local_128.blob_allocator);
              iVar16 = -100;
              if ((local_2b8.data != (void *)0x0) && ((long)local_2b8.c * local_2b8.cstep != 0)) {
                local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start = (int *)0x0;
                local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::vector<int,_std::allocator<int>_>::resize
                          (&local_e8,(long)(this->super_MultiHeadAttention).num_heads);
                uVar17 = (this->super_MultiHeadAttention).num_heads;
                if (0 < (int)uVar17) {
                  local_330 = (long)_w;
                  local_338 = (long)iVar15;
                  pMVar23 = (pointer)0x0;
                  local_340 = 0;
                  lVar18 = 0;
                  do {
                    local_2d8 = lVar18;
                    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                              (&local_a0,2,(allocator_type *)&local_88);
                    pMVar20 = local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                    iVar2 = local_268.w;
                    pAVar25 = local_268.allocator;
                    iVar16 = local_268.elempack;
                    lVar18 = (long)local_268.w;
                    sVar6 = CONCAT44(local_268.elemsize._4_4_,(undefined4)local_268.elemsize);
                    pvVar21 = (void *)((long)pMVar23 * lVar18 * sVar6 + (long)local_268.data);
                    piVar3 = (local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_start)->refcount;
                    local_2c8 = pMVar23;
                    if (piVar3 != (int *)0x0) {
                      LOCK();
                      *piVar3 = *piVar3 + -1;
                      UNLOCK();
                      if (*piVar3 == 0) {
                        if ((local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start)->allocator ==
                            (Allocator *)0x0) {
                          if ((local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                               _M_impl.super__Vector_impl_data._M_start)->data != (void *)0x0) {
                            free((local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->data);
                          }
                        }
                        else {
                          (*(local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start)->allocator->_vptr_Allocator
                            [3])();
                        }
                      }
                    }
                    pMVar23 = local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                    lVar19 = local_340;
                    iVar9 = local_388.w;
                    iVar8 = local_388.elempack;
                    pMVar20->data = (void *)0x0;
                    pMVar20->refcount = (int *)0x0;
                    *(undefined8 *)((long)&pMVar20->refcount + 4) = 0;
                    *(undefined8 *)((long)&pMVar20->elemsize + 4) = 0;
                    pMVar20->dims = 0;
                    pMVar20->w = 0;
                    pMVar20->h = 0;
                    pMVar20->d = 0;
                    pMVar20->data = pvVar21;
                    pMVar20->refcount = (int *)0x0;
                    pMVar20->elemsize = sVar6;
                    pMVar20->elempack = iVar16;
                    pMVar20->allocator = pAVar25;
                    pMVar20->dims = 2;
                    pMVar20->w = iVar2;
                    pMVar20->h = _w;
                    pMVar20->d = 1;
                    pMVar20->c = 1;
                    pMVar20->cstep = lVar18 * local_330;
                    lVar18 = (long)local_388.w;
                    sVar6 = CONCAT44(local_388.elemsize._4_4_,(undefined4)local_388.elemsize);
                    pvVar21 = (void *)(local_340 * lVar18 * sVar6 + (long)local_388.data);
                    piVar3 = local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start[1].refcount;
                    pAVar25 = local_388.allocator;
                    if (piVar3 != (int *)0x0) {
                      LOCK();
                      *piVar3 = *piVar3 + -1;
                      UNLOCK();
                      if (*piVar3 == 0) {
                        if (local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_start[1].allocator ==
                            (Allocator *)0x0) {
                          if (local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_start[1].data != (void *)0x0) {
                            local_2d0 = local_388.allocator;
                            free(local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                 _M_impl.super__Vector_impl_data._M_start[1].data);
                            pAVar25 = local_2d0;
                          }
                        }
                        else {
                          local_2d0 = local_388.allocator;
                          (*(local_a0.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start[1].allocator)->_vptr_Allocator
                            [3])();
                          pAVar25 = local_2d0;
                        }
                      }
                    }
                    pMVar23[1].cstep = 0;
                    *(undefined8 *)((long)&pMVar23[1].refcount + 4) = 0;
                    *(undefined8 *)((long)&pMVar23[1].elemsize + 4) = 0;
                    pMVar23[1].data = (void *)0x0;
                    pMVar23[1].refcount = (int *)0x0;
                    pMVar23[1].dims = 0;
                    pMVar23[1].w = 0;
                    pMVar23[1].h = 0;
                    pMVar23[1].d = 0;
                    pMVar23[1].data = pvVar21;
                    pMVar23[1].refcount = (int *)0x0;
                    pMVar23[1].elemsize = sVar6;
                    pMVar23[1].elempack = iVar8;
                    pMVar23[1].allocator = pAVar25;
                    pMVar23[1].dims = 2;
                    pMVar23[1].w = iVar9;
                    pMVar23[1].h = iVar15;
                    pMVar23[1].d = 1;
                    pMVar23[1].c = 1;
                    pMVar23[1].cstep = lVar18 * local_338;
                    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                              (&local_48,1,(allocator_type *)&local_88);
                    pMVar23 = local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                    iVar2 = local_2b8.w;
                    pAVar25 = local_2b8.allocator;
                    iVar16 = local_2b8.elempack;
                    lVar18 = (long)local_2b8.w;
                    sVar6 = CONCAT44(local_2b8.elemsize._4_4_,(undefined4)local_2b8.elemsize);
                    pvVar21 = (void *)((long)local_2b8.data + lVar19 * lVar18 * sVar6);
                    piVar3 = (local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_start)->refcount;
                    if (piVar3 != (int *)0x0) {
                      LOCK();
                      *piVar3 = *piVar3 + -1;
                      UNLOCK();
                      if (*piVar3 == 0) {
                        if ((local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start)->allocator ==
                            (Allocator *)0x0) {
                          if ((local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                               _M_impl.super__Vector_impl_data._M_start)->data != (void *)0x0) {
                            free((local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->data);
                          }
                        }
                        else {
                          (*(local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start)->allocator->_vptr_Allocator
                            [3])();
                        }
                      }
                    }
                    uVar4 = local_128._0_8_;
                    this = local_2c0;
                    lVar19 = local_338;
                    pMVar23->data = (void *)0x0;
                    pMVar23->refcount = (int *)0x0;
                    *(undefined8 *)((long)&pMVar23->refcount + 4) = 0;
                    *(undefined8 *)((long)&pMVar23->elemsize + 4) = 0;
                    pMVar23->dims = 0;
                    pMVar23->w = 0;
                    pMVar23->h = 0;
                    pMVar23->d = 0;
                    pMVar23->data = pvVar21;
                    pMVar23->refcount = (int *)0x0;
                    pMVar23->elemsize = sVar6;
                    pMVar23->elempack = iVar16;
                    pMVar23->allocator = pAVar25;
                    pMVar23->dims = 2;
                    pMVar23->w = iVar2;
                    pMVar23->h = iVar15;
                    pMVar23->d = 1;
                    pMVar23->c = 1;
                    pMVar23->cstep = lVar18 * local_338;
                    local_88.lightmode = local_128.lightmode;
                    local_88.use_shader_pack8 = local_128.use_shader_pack8;
                    local_88.use_subgroup_ops = local_128.use_subgroup_ops;
                    local_88.use_reserved_0 = local_128.use_reserved_0;
                    local_88.blob_allocator._0_4_ = local_128.blob_allocator._0_4_;
                    local_88.blob_allocator._4_4_ = local_128.blob_allocator._4_4_;
                    local_88.flush_denormals = local_128.flush_denormals;
                    local_88.use_local_pool_allocator = local_128.use_local_pool_allocator;
                    local_88.use_shader_local_memory = local_128.use_shader_local_memory;
                    local_88.use_cooperative_matrix = local_128.use_cooperative_matrix;
                    local_88.use_winograd23_convolution = local_128.use_winograd23_convolution;
                    local_88.use_winograd43_convolution = local_128.use_winograd43_convolution;
                    local_88.use_winograd63_convolution = local_128.use_winograd63_convolution;
                    local_88.use_a53_a55_optimized_kernel = local_128.use_a53_a55_optimized_kernel;
                    local_88.use_fp16_uniform = local_128.use_fp16_uniform;
                    local_88.use_int8_uniform = local_128.use_int8_uniform;
                    local_88.use_reserved_9 = local_128.use_reserved_9;
                    local_88.use_reserved_10 = local_128.use_reserved_10;
                    local_88.use_reserved_11 = local_128.use_reserved_11;
                    local_88.use_bf16_storage = local_128.use_bf16_storage;
                    local_88.use_fp16_packed = local_128.use_fp16_packed;
                    local_88.use_fp16_storage = local_128.use_fp16_storage;
                    local_88.use_fp16_arithmetic = local_128.use_fp16_arithmetic;
                    local_88.use_int8_packed = local_128.use_int8_packed;
                    local_88.use_int8_storage = local_128.use_int8_storage;
                    local_88.use_int8_arithmetic = local_128.use_int8_arithmetic;
                    local_88.use_packing_layout = local_128.use_packing_layout;
                    local_88.vulkan_device_index = local_128.vulkan_device_index;
                    local_88.use_reserved_1 = local_128.use_reserved_1;
                    local_88.use_image_storage = local_128.use_image_storage;
                    local_88.use_tensor_storage = local_128.use_tensor_storage;
                    local_88.use_reserved_2 = local_128.use_reserved_2;
                    local_88.workspace_allocator._0_4_ = local_128.workspace_allocator._0_4_;
                    local_88.workspace_allocator._4_4_ = local_128.workspace_allocator._4_4_;
                    local_88.openmp_blocktime = local_128.openmp_blocktime;
                    local_88.use_winograd_convolution = local_128.use_winograd_convolution;
                    local_88.use_sgemm_convolution = local_128.use_sgemm_convolution;
                    local_88.use_int8_inference = local_128.use_int8_inference;
                    local_88.use_vulkan_compute = local_128.use_vulkan_compute;
                    local_88.num_threads = 1;
                    local_128._0_8_ = uVar4;
                    iVar16 = (*local_2c0->qkv_gemm->_vptr_Layer[6])
                                       (local_2c0->qkv_gemm,&local_a0,&local_48,&local_88);
                    lVar18 = local_2d8;
                    local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[local_2d8] = iVar16;
                    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_48);
                    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_a0);
                    lVar18 = lVar18 + 1;
                    uVar17 = (this->super_MultiHeadAttention).num_heads;
                    local_340 = local_340 + lVar19;
                    pMVar23 = (pointer)((long)&local_2c8->data + local_330);
                  } while (lVar18 < (int)uVar17);
                }
                bVar28 = 0 < (int)uVar17;
                iVar16 = iVar22;
                if ((0 < (int)uVar17) &&
                   (iVar16 = *local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                   *local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start == 0)) {
                  uVar14 = 1;
                  do {
                    uVar24 = uVar14;
                    iVar16 = iVar22;
                    if (uVar17 == uVar24) break;
                    iVar16 = local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar24];
                    uVar14 = uVar24 + 1;
                  } while (iVar16 == 0);
                  bVar28 = uVar24 < uVar17;
                }
                if (!bVar28) {
                  piVar3 = (int *)CONCAT44(local_388.refcount._4_4_,local_388.refcount._0_4_);
                  if (piVar3 != (int *)0x0) {
                    LOCK();
                    *piVar3 = *piVar3 + -1;
                    UNLOCK();
                    if (*piVar3 == 0) {
                      if (local_388.allocator == (Allocator *)0x0) {
                        if (local_388.data != (void *)0x0) {
                          free(local_388.data);
                        }
                      }
                      else {
                        (*(local_388.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_388.cstep = 0;
                  local_388.data = (void *)0x0;
                  local_388.refcount._0_4_ = 0;
                  local_388.refcount._4_4_ = 0;
                  local_388.elemsize._0_4_ = 0;
                  local_388.elemsize._4_4_ = 0;
                  local_388.elempack = 0;
                  local_388.dims = 0;
                  local_388.w = 0;
                  local_388.h = 0;
                  local_388.d = 0;
                  local_388.c = 0;
                  iVar16 = (*this->o_gemm->_vptr_Layer[7])
                                     (this->o_gemm,&local_2b8,
                                      (local_a8->
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                      _M_impl.super__Vector_impl_data._M_start,&local_128);
                }
                if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (int *)0x0) {
                  operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_e8.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_e8.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
              }
              piVar3 = (int *)CONCAT44(local_2b8.refcount._4_4_,local_2b8.refcount._0_4_);
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + -1;
                UNLOCK();
                if (*piVar3 == 0) {
                  if (local_2b8.allocator == (Allocator *)0x0) {
                    if (local_2b8.data != (void *)0x0) {
                      free(local_2b8.data);
                    }
                  }
                  else {
                    (*(local_2b8.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_2b8.cstep = 0;
              local_2b8.data = (long *)0x0;
              local_2b8.refcount._0_4_ = 0;
              local_2b8.refcount._4_4_ = 0;
              local_2b8.elemsize._0_4_ = 0;
              local_2b8.elemsize._4_4_ = 0;
              local_2b8.elempack = 0;
              local_2b8.dims = 0;
              local_2b8.w = 0;
              local_2b8.h = 0;
              local_2b8.d = 0;
              local_2b8.c = 0;
            }
            piVar3 = (int *)CONCAT44(local_388.refcount._4_4_,local_388.refcount._0_4_);
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (local_388.allocator == (Allocator *)0x0) {
                  if (local_388.data != (void *)0x0) {
                    free(local_388.data);
                  }
                }
                else {
                  (*(local_388.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            local_388.cstep = 0;
            local_388.data = (void *)0x0;
            local_388.refcount._0_4_ = 0;
            local_388.refcount._4_4_ = 0;
            local_388.elemsize._0_4_ = 0;
            local_388.elemsize._4_4_ = 0;
            local_388.elempack = 0;
            local_388.dims = 0;
            local_388.w = 0;
            local_388.h = 0;
            local_388.d = 0;
            local_388.c = 0;
          }
        }
        if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (int *)0x0) {
          operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
      piVar3 = (int *)CONCAT44(local_268.refcount._4_4_,local_268.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_268.allocator == (Allocator *)0x0) {
            if (local_268.data != (void *)0x0) {
              free(local_268.data);
            }
          }
          else {
            (*(local_268.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_268.cstep = 0;
      local_268.data = (void *)0x0;
      local_268.refcount._0_4_ = 0;
      local_268.refcount._4_4_ = 0;
      local_268.elemsize._0_4_ = 0;
      local_268.elemsize._4_4_ = 0;
      local_268.elempack = 0;
      local_268.dims = 0;
      local_268.w = 0;
      local_268.h = 0;
      local_268.d = 0;
      local_268.c = 0;
    }
    piVar3 = (int *)CONCAT44(uStack_1bc,uStack_1c0);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_1a8 == (long *)0x0) {
          if (local_1c8 != (void *)0x0) {
            free(local_1c8);
          }
        }
        else {
          (**(code **)(*local_1a8 + 0x18))();
        }
      }
    }
    local_188 = 0;
    local_1c8 = (void *)0x0;
    uStack_1c0 = 0;
    uStack_1bc = 0;
    local_1b8 = 0;
    uStack_1b4 = 0;
    local_1b0 = 0;
    uStack_1a0 = 0;
    iStack_19c = 0;
    uStack_198 = 0;
    uStack_194 = 0;
    local_190 = 0;
  }
  piVar3 = (int *)CONCAT44(uStack_16c,uStack_170);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_158 == (long *)0x0) {
        if (local_178 != (void *)0x0) {
          free(local_178);
        }
      }
      else {
        (**(code **)(*local_158 + 0x18))();
      }
    }
  }
  local_138 = 0;
  local_178 = (void *)0x0;
  uStack_170 = 0;
  uStack_16c = 0;
  local_168 = 0;
  uStack_164 = 0;
  local_160 = 0;
  uStack_150 = 0;
  iStack_14c = 0;
  uStack_148 = 0;
  uStack_144 = 0;
  local_140 = 0;
LAB_00562dac:
  piVar3 = (int *)CONCAT44(local_328.refcount._4_4_,local_328.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_328.allocator == (Allocator *)0x0) {
        if (local_328.data != (void *)0x0) {
          free(local_328.data);
        }
      }
      else {
        (*(local_328.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_328.cstep = 0;
  local_328.data = (void *)0x0;
  local_328.refcount._0_4_ = 0;
  local_328.refcount._4_4_ = 0;
  local_328.elemsize._0_4_ = 0;
  local_328.elemsize._4_4_ = 0;
  local_328.elempack = 0;
  local_328.dims = 0;
  local_328.w = 0;
  local_328.h = 0;
  local_328.d = 0;
  local_328.c = 0;
  piVar3 = (int *)CONCAT44(local_218.refcount._4_4_,local_218.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_218.allocator == (Allocator *)0x0) {
        if (local_218.data != (void *)0x0) {
          free(local_218.data);
        }
      }
      else {
        (*(local_218.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar16;
}

Assistant:

int MultiHeadAttention_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& _opt) const
{
    const Mat& q_blob = bottom_blobs[0];
    const Mat& k_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : bottom_blobs[1];
    const Mat& v_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : (bottom_blobs.size() == 2 || (bottom_blobs.size() == 3 && attn_mask)) ? k_blob : bottom_blobs[2];
    const Mat& attn_mask_blob = attn_mask ? bottom_blobs[bottom_blobs.size() - 1] : Mat();

    Option opt = _opt;
    if (int8_scale_term)
    {
        opt.use_packing_layout = false; // TODO enable packing
    }

    Mat attn_mask_blob_unpacked;
    if (attn_mask && attn_mask_blob.elempack != 1)
    {
        convert_packing(attn_mask_blob, attn_mask_blob_unpacked, 1, opt);
        if (attn_mask_blob_unpacked.empty())
            return -100;
    }
    else
    {
        attn_mask_blob_unpacked = attn_mask_blob;
    }

    const int embed_dim_per_head = embed_dim / num_heads;
    const int src_seqlen = q_blob.h * q_blob.elempack;
    const int dst_seqlen = k_blob.h * k_blob.elempack;

    Mat q_affine;
    int retq = q_gemm->forward(q_blob, q_affine, opt);
    if (retq != 0)
        return retq;

    Mat k_affine;
    int retk = k_gemm->forward(k_blob, k_affine, opt);
    if (retk != 0)
        return retk;

    Mat qk_cross(dst_seqlen, src_seqlen * num_heads, 4u, opt.blob_allocator);
    if (qk_cross.empty())
        return -100;

    std::vector<int> retqks;
    retqks.resize(num_heads);
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_heads; i++)
    {
        std::vector<Mat> qk_bottom_blobs(2);
        qk_bottom_blobs[0] = q_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        qk_bottom_blobs[1] = k_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        if (attn_mask)
        {
            const Mat& maskm = attn_mask_blob_unpacked.dims == 3 ? attn_mask_blob_unpacked.channel(i) : attn_mask_blob_unpacked;
            qk_bottom_blobs.push_back(maskm);
        }
        std::vector<Mat> qk_top_blobs(1);
        qk_top_blobs[0] = qk_cross.row_range(i * src_seqlen, src_seqlen);
        Option opt1 = opt;
        opt1.num_threads = 1;
        retqks[i] = qk_gemm->forward(qk_bottom_blobs, qk_top_blobs, opt1);
    }
    for (int i = 0; i < num_heads; i++)
    {
        if (retqks[i] != 0)
            return retqks[i];
    }

    q_affine.release();
    k_affine.release();

    int retqk = qk_softmax->forward_inplace(qk_cross, opt);
    if (retqk != 0)
        return retqk;

    Mat v_affine;
    int retv = v_gemm->forward(v_blob, v_affine, opt);
    if (retv != 0)
        return retv;

    Mat qkv_cross(src_seqlen, embed_dim_per_head * num_heads, 4u, opt.blob_allocator);
    if (qkv_cross.empty())
        return -100;

    std::vector<int> retqkvs;
    retqkvs.resize(num_heads);
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_heads; i++)
    {
        std::vector<Mat> qkv_bottom_blobs(2);
        qkv_bottom_blobs[0] = qk_cross.row_range(i * src_seqlen, src_seqlen);
        qkv_bottom_blobs[1] = v_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        std::vector<Mat> qkv_top_blobs(1);
        qkv_top_blobs[0] = qkv_cross.row_range(i * embed_dim_per_head, embed_dim_per_head);
        Option opt1 = opt;
        opt1.num_threads = 1;
        retqkvs[i] = qkv_gemm->forward(qkv_bottom_blobs, qkv_top_blobs, opt1);
    }
    for (int i = 0; i < num_heads; i++)
    {
        if (retqkvs[i] != 0)
            return retqkvs[i];
    }

    v_affine.release();

    int reto = o_gemm->forward(qkv_cross, top_blobs[0], opt);
    if (reto != 0)
        return reto;

    return 0;
}